

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

_Bool binary_fuse8_allocate(uint32_t size,binary_fuse8_t *filter)

{
  void *pvVar1;
  long in_RSI;
  uint in_EDI;
  double dVar2;
  uint32_t initSegmentCount;
  uint32_t capacity;
  double sizeFactor;
  uint32_t arity;
  undefined4 local_3c;
  undefined8 in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd0;
  undefined4 local_2c;
  
  *(uint *)(in_RSI + 8) = in_EDI;
  if (in_EDI == 0) {
    local_2c = 4;
  }
  else {
    local_2c = binary_fuse_calculate_segment_length
                         (in_stack_ffffffffffffffd0,
                          (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  *(uint32_t *)(in_RSI + 0xc) = local_2c;
  if (0x40000 < *(uint *)(in_RSI + 0xc)) {
    *(undefined4 *)(in_RSI + 0xc) = 0x40000;
  }
  *(int *)(in_RSI + 0x10) = *(int *)(in_RSI + 0xc) + -1;
  if (in_EDI < 2) {
    local_3c = 0;
  }
  else {
    dVar2 = binary_fuse_calculate_size_factor
                      ((uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (uint32_t)in_stack_ffffffffffffffc8);
    dVar2 = round((double)in_EDI * dVar2);
    local_3c = (int)(long)dVar2;
  }
  *(uint *)(in_RSI + 0x1c) =
       (((local_3c + *(int *)(in_RSI + 0xc)) - 1U) / *(uint *)(in_RSI + 0xc)) *
       *(int *)(in_RSI + 0xc);
  *(uint *)(in_RSI + 0x14) =
       ((*(int *)(in_RSI + 0x1c) + *(int *)(in_RSI + 0xc)) - 1U) / *(uint *)(in_RSI + 0xc);
  if (*(uint *)(in_RSI + 0x14) < 3) {
    *(undefined4 *)(in_RSI + 0x14) = 1;
  }
  else {
    *(int *)(in_RSI + 0x14) = *(int *)(in_RSI + 0x14) + -2;
  }
  *(int *)(in_RSI + 0x1c) = (*(int *)(in_RSI + 0x14) + 2) * *(int *)(in_RSI + 0xc);
  *(int *)(in_RSI + 0x18) = *(int *)(in_RSI + 0x14) * *(int *)(in_RSI + 0xc);
  pvVar1 = calloc((ulong)*(uint *)(in_RSI + 0x1c),1);
  *(void **)(in_RSI + 0x20) = pvVar1;
  return *(long *)(in_RSI + 0x20) != 0;
}

Assistant:

static inline bool binary_fuse8_allocate(uint32_t size,
                                         binary_fuse8_t *filter) {
  uint32_t arity = 3;
  filter->Size = size;
  filter->SegmentLength = size == 0 ? 4 : binary_fuse_calculate_segment_length(arity, size);
  if (filter->SegmentLength > 262144) {
    filter->SegmentLength = 262144;
  }
  filter->SegmentLengthMask = filter->SegmentLength - 1;
  double sizeFactor = size <= 1 ? 0 : binary_fuse_calculate_size_factor(arity, size);
  uint32_t capacity = size <= 1 ? 0 : (uint32_t)(round((double)size * sizeFactor));
  uint32_t initSegmentCount =
      (capacity + filter->SegmentLength - 1) / filter->SegmentLength -
      (arity - 1);
  filter->ArrayLength = (initSegmentCount + arity - 1) * filter->SegmentLength;
  filter->SegmentCount =
      (filter->ArrayLength + filter->SegmentLength - 1) / filter->SegmentLength;
  if (filter->SegmentCount <= arity - 1) {
    filter->SegmentCount = 1;
  } else {
    filter->SegmentCount = filter->SegmentCount - (arity - 1);
  }
  filter->ArrayLength =
      (filter->SegmentCount + arity - 1) * filter->SegmentLength;
  filter->SegmentCountLength = filter->SegmentCount * filter->SegmentLength;
  filter->Fingerprints =
      (uint8_t *)calloc(filter->ArrayLength, sizeof(uint8_t));
  return filter->Fingerprints != NULL;
}